

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O1

void pd_tilde_tick(t_pd_tilde *x)

{
  uint uVar1;
  t_atom *ptVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  t_atom *ptVar7;
  
  uVar1 = binbuf_getnatom(x->x_binbuf);
  ptVar2 = binbuf_getvec(x->x_binbuf);
  if (0 < (int)uVar1) {
    uVar6 = 0;
    uVar4 = 0;
    ptVar7 = ptVar2;
    do {
      if (ptVar7->a_type == A_SEMI) {
        lVar3 = (long)(int)uVar4;
        iVar5 = (int)uVar6;
        if (lVar3 < (long)uVar6) {
          if (ptVar2[lVar3].a_type == A_SYMBOL) {
            outlet_anything(x->x_outlet1,ptVar2[lVar3].a_w.w_symbol,~uVar4 + iVar5,
                            ptVar2 + lVar3 + 1);
          }
          else {
            outlet_list(x->x_outlet1,(t_symbol *)0x0,iVar5 - uVar4,ptVar2 + lVar3);
          }
        }
        uVar4 = iVar5 + 1;
      }
      uVar6 = uVar6 + 1;
      ptVar7 = ptVar7 + 1;
    } while (uVar1 != uVar6);
  }
  binbuf_clear(x->x_binbuf);
  return;
}

Assistant:

static void pd_tilde_tick(t_pd_tilde *x)
{
    int messstart = 0, i, n;
    t_atom *vec;
    /* binbuf_print(b); */
    n = binbuf_getnatom(x->x_binbuf);
    vec = binbuf_getvec(x->x_binbuf);
    for (i = 0; i < n; i++)
    {
        if (vec[i].a_type == A_SEMI)
        {
            if (i > messstart && vec[messstart].a_type == A_SYMBOL)
                outlet_anything(x->x_outlet1, vec[messstart].a_w.w_symbol,
                    i-(messstart+1), vec+(messstart+1));
            else if (i > messstart)
                outlet_list(x->x_outlet1, 0, i-messstart, vec+messstart);
            messstart = i+1;
        }
    }
    binbuf_clear(x->x_binbuf);
}